

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_BuildAudioCVT(SDL12_AudioCVT *cvt12,Uint16 src_format,Uint8 src_channels,int src_rate,
                     Uint16 dst_format,Uint8 dst_channels,int dst_rate)

{
  int iVar1;
  double local_d0;
  double len_ratio;
  int local_c0;
  int len_mult;
  Uint32 lo_rate;
  Uint32 hi_rate;
  int diff_1;
  int diff;
  size_t channel_mash;
  SDL_AudioCVT cvt20;
  int retval;
  Uint8 dst_channels_local;
  Uint16 dst_format_local;
  int src_rate_local;
  Uint8 src_channels_local;
  Uint16 src_format_local;
  SDL12_AudioCVT *cvt12_local;
  
  cvt20.filters[9]._4_4_ = 0;
  cvt20.filter_index._1_1_ = dst_channels;
  cvt20.filter_index._2_2_ = dst_format;
  (*SDL20_memset)(cvt12,0,0x88);
  if (WantCompatibilityAudioCVT == SDL_FALSE) {
    cvt20.filters[9]._4_4_ =
         (*SDL20_BuildAudioCVT)
                   ((SDL_AudioCVT *)&channel_mash,src_format,src_channels,src_rate,
                    cvt20.filter_index._2_2_,cvt20.filter_index._1_1_,dst_rate);
    AudioCVT20to12((SDL_AudioCVT *)&channel_mash,cvt12);
  }
  else {
    if (((src_format == cvt20.filter_index._2_2_) && (src_channels == cvt20.filter_index._1_1_)) &&
       (src_rate == dst_rate)) {
      return 0;
    }
    cvt12->needed = 1;
    cvt12->len_mult = 1;
    cvt12->len_ratio = 1.0;
    cvt12->src_format = src_format;
    cvt12->dst_format = cvt20.filter_index._2_2_;
    if ((src_format != cvt20.filter_index._2_2_) || (src_channels != cvt20.filter_index._1_1_)) {
      if (src_format != cvt20.filter_index._2_2_) {
        if ((src_format & 0xff) < (cvt20.filter_index._2_2_ & 0xff)) {
          cvt12->len_mult = cvt12->len_mult << 1;
          cvt12->len_ratio = cvt12->len_ratio * 2.0;
        }
        else {
          cvt12->len_ratio = cvt12->len_ratio / 2.0;
        }
      }
      if (src_channels < cvt20.filter_index._1_1_) {
        iVar1 = (int)((ulong)cvt20.filter_index._1_1_ / (ulong)(long)(int)(uint)src_channels);
        cvt12->len_mult = iVar1 * cvt12->len_mult;
        cvt12->len_ratio = (double)iVar1 * cvt12->len_ratio;
      }
      else if (cvt20.filter_index._1_1_ < src_channels) {
        cvt12->len_ratio =
             cvt12->len_ratio /
             (double)(int)((ulong)src_channels / (ulong)(long)(int)(uint)cvt20.filter_index._1_1_);
      }
      iVar1 = cvt12->filter_index;
      cvt12->filter_index = iVar1 + 1;
      cvt12->filters[iVar1] = CompatibilityCVT_RunStream;
      cvt12->filters[9] =
           (SDL12_AudioCVTFilter)(ulong)CONCAT11(cvt20.filter_index._1_1_,src_channels);
    }
    if (src_rate != dst_rate) {
      local_c0 = dst_rate;
      len_ratio._4_4_ = 1;
      local_d0 = 0.5;
      len_mult = src_rate;
      if (src_rate < dst_rate) {
        len_mult = dst_rate;
        len_ratio._4_4_ = 2;
        local_d0 = 2.0;
        local_c0 = src_rate;
      }
      while ((uint)(local_c0 << 1) / 100 <= (uint)len_mult / 100) {
        if (7 < cvt12->filter_index) {
          iVar1 = (*SDL20_SetError)("Too many conversion filters needed");
          return iVar1;
        }
        iVar1 = cvt12->filter_index;
        cvt12->filter_index = iVar1 + 1;
        cvt12->filters[iVar1] = CompatibilityCVT_Resampler;
        cvt12->len_mult = len_ratio._4_4_ * cvt12->len_mult;
        local_c0 = local_c0 << 1;
        cvt12->len_ratio = local_d0 * cvt12->len_ratio;
      }
      cvt12->rate_incr = (double)src_rate / (double)dst_rate;
    }
    cvt20.filters[9]._4_4_ = 1;
  }
  return cvt20.filters[9]._4_4_;
}

Assistant:

SDLCALL
SDL_BuildAudioCVT(SDL12_AudioCVT *cvt12, Uint16 src_format, Uint8 src_channels, int src_rate, Uint16 dst_format, Uint8 dst_channels, int dst_rate)
{
    int retval = 0;

    SDL20_zerop(cvt12); /* SDL 1.2 derefences cvt12 without checking for NULL */

    if (!WantCompatibilityAudioCVT) {
        SDL_AudioCVT cvt20;
        retval = SDL20_BuildAudioCVT(&cvt20, src_format, src_channels, src_rate, dst_format, dst_channels, dst_rate);
        AudioCVT20to12(&cvt20, cvt12);
    } else {
        const size_t channel_mash = ((size_t) src_channels) | (((size_t) dst_channels) << 8);

        if ((src_format == dst_format) && (src_channels == dst_channels) && (src_rate == dst_rate)) {
            return 0;  /* no conversion needed. */
        }

        cvt12->needed = 1;
        cvt12->len_mult = 1;
        cvt12->len_ratio = 1.0;
        cvt12->src_format = src_format;
        cvt12->dst_format = dst_format;

        if ((src_format != dst_format) || (src_channels != dst_channels)) {
            if (src_format != dst_format) {
                /* there are only 8 and 16 bit formats in SDL 1.2 */
                if (SDL_AUDIO_BITSIZE(src_format) < SDL_AUDIO_BITSIZE(dst_format)) {
                    cvt12->len_mult *= 2;
                    cvt12->len_ratio *= 2.0;
                } else {
                    cvt12->len_ratio /= 2.0;
                }
            }

            /* SDL 1.2 only supported 1, 2, 4, and 6 channels, and would fail to convert between 4 and 6 at all. :O */
            if (src_channels < dst_channels) {
                const int diff = (int) (dst_channels / src_channels);
                cvt12->len_mult *= diff;
                cvt12->len_ratio *= (double) diff;
            } else if (src_channels > dst_channels) {
                const int diff = (int) (src_channels / dst_channels);
                cvt12->len_ratio /= (double) diff;
            }

            cvt12->filters[cvt12->filter_index++] = CompatibilityCVT_RunStream;
            cvt12->filters[SDL_arraysize(cvt12->filters) - 1] = (SDL12_AudioCVTFilter) channel_mash;  /* cheat by hiding this info at end of array. */
        }

        if (src_rate != dst_rate) {
            Uint32 hi_rate = src_rate;
            Uint32 lo_rate = dst_rate;
            int len_mult = 1;
            double len_ratio = 0.5;

            if (src_rate < dst_rate) {  /* flip everything. */
                hi_rate = dst_rate;
                lo_rate = src_rate;
                len_mult = 2;
                len_ratio = 2.0;
            }

            while (((lo_rate * 2) / 100) <= (hi_rate / 100)) {   /* this is what SDL 1.2 does. *shrug* */
                if (cvt12->filter_index >= (int)(SDL_arraysize(cvt12->filters) - 2)) {
                    return SDL20_SetError("Too many conversion filters needed");
                }
                cvt12->filters[cvt12->filter_index++] = CompatibilityCVT_Resampler;
                cvt12->len_mult *= len_mult;
                lo_rate *= 2;
                cvt12->len_ratio *= len_ratio;
            }

            cvt12->rate_incr = ((double) src_rate) / ((double) dst_rate);
        }

        retval = 1;  /* conversion definitely needed. */
    }

    return retval;
}